

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *__stream;
  undefined8 uVar1;
  int iVar2;
  CommandOptions Options;
  Result_t result;
  CommandOptions local_140;
  CommandOptions local_e0;
  int local_78 [26];
  
  Kumu::Result_t::Result_t((Result_t *)local_78,(Result_t *)&Kumu::RESULT_FAIL);
  CommandOptions::CommandOptions(&local_140,argc,argv);
  __stream = _stdout;
  if (local_140.version_flag == true) {
    uVar1 = Kumu::Version();
    fprintf(__stream,
            "\n%s (asdcplib %s)\n\nCopyright (c) 2005-2009 John Hurst\n%s is part of the asdcplib DCP tools package.\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
            ,"kmfilegen",uVar1,"kmfilegen","kmfilegen");
  }
  if (local_140.help_flag == true) {
    fprintf(_stdout,
            "USAGE: %s [-c <file-size>] [-v] <output-file>\n\n       %s [-o <fwd|rev|rand>] [-v] <input-file>\n\n       %s [-w <output-file>] [-v] <input-file>\n\n       %s [-h|-help] [-V]\n\n  -c <file-size>     - Create test file containing <file-size> megabytes of data\n  -h | -help         - Show help\n  -o <fwd|rev|rand>  - Specify order used when validating a file.\n                       One of fwd|rev|rand, default is rand\n  -v                 - Verbose. Prints informative messages to stderr\n  -V                 - Show version information\n  -w <output-file>   - Read-Validate-Write - file is written to <output-file>\n                       (sequential read only)\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
            ,"kmfilegen","kmfilegen","kmfilegen","kmfilegen");
  }
  iVar2 = 0;
  if ((local_140.version_flag != false) || (iVar2 = 0, local_140.help_flag != false))
  goto LAB_001056be;
  if (local_140.error_flag == true) {
    main_cold_2();
    iVar2 = 3;
    goto LAB_001056be;
  }
  if (local_140.mode == MMT_VAL_WRITE) {
    ReadValidateWriteLargeFile(&local_e0);
    Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)&local_e0);
LAB_001056a5:
    Kumu::Result_t::~Result_t((Result_t *)&local_e0);
  }
  else {
    if (local_140.mode == MMT_VALIDATE) {
      ValidateLargeFile(&local_e0);
      Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)&local_e0);
      goto LAB_001056a5;
    }
    if (local_140.mode == MMT_CREATE) {
      CreateLargeFile(&local_e0);
      Kumu::Result_t::operator=((Result_t *)local_78,(Result_t *)&local_e0);
      goto LAB_001056a5;
    }
  }
  if (local_78[0] != Kumu::RESULT_OK) {
    main_cold_1();
    iVar2 = local_e0._0_4_;
  }
LAB_001056be:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.write_filename._M_dataplus._M_p != &local_140.write_filename.field_2) {
    operator_delete(local_140.write_filename._M_dataplus._M_p,
                    local_140.write_filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.filename._M_dataplus._M_p != &local_140.filename.field_2) {
    operator_delete(local_140.filename._M_dataplus._M_p,
                    local_140.filename.field_2._M_allocated_capacity + 1);
  }
  Kumu::Result_t::~Result_t((Result_t *)local_78);
  return iVar2;
}

Assistant:

int
main(int argc, const char **argv)
{
  Result_t result = RESULT_FAIL;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  switch ( Options.mode )
    {

    case MMT_CREATE:
      result = CreateLargeFile(Options);
      break;

    case MMT_VALIDATE:
      result = ValidateLargeFile(Options);
      break;

    case MMT_VAL_WRITE:
      result = ReadValidateWriteLargeFile(Options);
      break;
    }

  if ( result != RESULT_OK )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result.Label(), stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}